

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O2

void __thiscall Ptex::v2_2::PtexSeparableKernel::upresU(PtexSeparableKernel *this)

{
  float fVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  long lVar5;
  
  pfVar3 = this->ku;
  iVar2 = this->uw;
  iVar4 = iVar2 * 2;
  for (lVar5 = 0; 0 < iVar2 + (int)lVar5; lVar5 = lVar5 + -1) {
    fVar1 = pfVar3[(long)iVar2 + lVar5 + -1];
    pfVar3[(long)iVar4 + lVar5 * 2 + -1] = fVar1 * 0.5;
    pfVar3[(long)iVar4 + lVar5 * 2 + -2] = fVar1 * 0.5;
  }
  this->uw = iVar4;
  this->u = this->u << 1;
  (this->res).ulog2 = (this->res).ulog2 + '\x01';
  return;
}

Assistant:

void upresU()
    {
        float* src = ku + uw-1;
        float* dst = ku + uw*2-2;
        for (int i = uw; i > 0; i--) {
            dst[0] = dst[1] = *src-- / 2;
            dst -=2;
        }
        uw *= 2;
        u *= 2;
        res.ulog2++;
    }